

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

int __thiscall libtorrent::aux::session_impl::next_port(session_impl *this)

{
  mutex *pmVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_40;
  
  pmVar1 = &(this->m_settings).m_mutex;
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  uVar2 = (this->m_settings).m_store.m_ints._M_elems[0x26];
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  local_40._M_owns = false;
  local_40._M_device = pmVar1;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  iVar5 = (this->m_settings).m_store.m_ints._M_elems[0x27] + uVar2;
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  uVar3 = this->m_next_port;
  uVar4 = uVar3;
  if (iVar5 < (int)uVar3) {
    uVar4 = uVar2;
  }
  if ((int)uVar3 < (int)uVar2) {
    uVar4 = uVar2;
  }
  uVar3 = uVar4 + 1;
  if (iVar5 <= (int)uVar4) {
    uVar3 = uVar2;
  }
  this->m_next_port = uVar3;
  session_log(this," *** BINDING OUTGOING CONNECTION [ port: %d ]",(ulong)uVar4);
  return uVar4;
}

Assistant:

int session_impl::next_port() const
	{
		int start = m_settings.get_int(settings_pack::outgoing_port);
		int num = m_settings.get_int(settings_pack::num_outgoing_ports);
		std::pair<int, int> out_ports(start, start + num);
		if (m_next_port < out_ports.first || m_next_port > out_ports.second)
			m_next_port = out_ports.first;

		int port = m_next_port;
		++m_next_port;
		if (m_next_port > out_ports.second) m_next_port = out_ports.first;
#ifndef TORRENT_DISABLE_LOGGING
		session_log(" *** BINDING OUTGOING CONNECTION [ port: %d ]", port);
#endif
		return port;
	}